

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_ConcatString3(JSContext *ctx,char *str1,JSValue str2,char *str3)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  JSValue JVar4;
  StringBuffer b_s;
  JSValueUnion local_68;
  StringBuffer local_60;
  JSContext *local_40;
  uint8_t *local_38;
  
  if (((int)str2.tag == -7) || (str2 = JS_ToStringFree(ctx,str2), (int)str2.tag != 6)) {
    local_68 = str2.u;
    sVar2 = strlen(str1);
    sVar3 = strlen(str3);
    local_60.size = (*(uint *)((long)local_68.ptr + 4) & 0x7fffffff) + (int)sVar3 + (int)sVar2;
    local_60.is_wide_char = *(uint *)((long)local_68.ptr + 4) >> 0x1f;
    local_60.len = 0;
    local_60.error_status = 0;
    local_60.ctx = ctx;
    local_38 = (uint8_t *)str3;
    local_60.str = js_alloc_string(ctx,local_60.size,local_60.is_wide_char);
    if (local_60.str != (JSString *)0x0) {
      local_40 = ctx;
      string_buffer_write8(&local_60,(uint8_t *)str1,(int)sVar2);
      string_buffer_concat
                (&local_60,(JSString *)local_68.ptr,0,*(uint *)((long)local_68.ptr + 4) & 0x7fffffff
                );
      string_buffer_write8(&local_60,local_38,(int)sVar3);
      if ((0xfffffff4 < (uint)str2.tag) &&
         (iVar1 = *local_68.ptr, *(int *)local_68.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(local_40->rt,str2);
      }
      JVar4 = string_buffer_end(&local_60);
      return JVar4;
    }
    local_60.size = 0;
    local_60.error_status = -1;
    local_60.str = (JSString *)0x0;
  }
  local_68 = str2.u;
  if ((0xfffffff4 < (uint)str2.tag) &&
     (iVar1 = *local_68.ptr, *(int *)local_68.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,str2);
  }
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue JS_ConcatString3(JSContext *ctx, const char *str1,
                                JSValue str2, const char *str3)
{
    StringBuffer b_s, *b = &b_s;
    int len1, len3;
    JSString *p;

    if (unlikely(JS_VALUE_GET_TAG(str2) != JS_TAG_STRING)) {
        str2 = JS_ToStringFree(ctx, str2);
        if (JS_IsException(str2))
            goto fail;
    }
    p = JS_VALUE_GET_STRING(str2);
    len1 = strlen(str1);
    len3 = strlen(str3);

    if (string_buffer_init2(ctx, b, len1 + p->len + len3, p->is_wide_char))
        goto fail;

    string_buffer_write8(b, (const uint8_t *)str1, len1);
    string_buffer_concat(b, p, 0, p->len);
    string_buffer_write8(b, (const uint8_t *)str3, len3);

    JS_FreeValue(ctx, str2);
    return string_buffer_end(b);

 fail:
    JS_FreeValue(ctx, str2);
    return JS_EXCEPTION;
}